

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O2

int uv_queue_work(uv_loop_t *loop,uv_work_t *req,uv_work_cb work_cb,uv_after_work_cb after_work_cb)

{
  long *plVar1;
  
  if (work_cb != (uv_work_cb)0x0) {
    req->type = UV_WORK;
    req->active_queue[0] = loop->active_reqs;
    plVar1 = (long *)loop->active_reqs[1];
    req->active_queue[1] = plVar1;
    *plVar1 = (long)req->active_queue;
    loop->active_reqs[1] = req->active_queue;
    req->loop = loop;
    req->work_cb = work_cb;
    req->after_work_cb = after_work_cb;
    uv__work_submit(loop,&req->work_req,uv__queue_work,uv__queue_done);
    return 0;
  }
  return -0x16;
}

Assistant:

int uv_queue_work(uv_loop_t* loop,
                  uv_work_t* req,
                  uv_work_cb work_cb,
                  uv_after_work_cb after_work_cb) {
  if (work_cb == NULL)
    return UV_EINVAL;

  uv__req_init(loop, req, UV_WORK);
  req->loop = loop;
  req->work_cb = work_cb;
  req->after_work_cb = after_work_cb;
  uv__work_submit(loop, &req->work_req, uv__queue_work, uv__queue_done);
  return 0;
}